

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmldate.c
# Opt level: O0

datetime_t EBML_DateTime(ebml_date *Element)

{
  bool_t bVar1;
  ebml_date *Element_local;
  
  bVar1 = Node_IsPartOf(Element,0x54444245);
  if (bVar1 == 0) {
    __assert_fail("Node_IsPartOf(Element,EBML_DATE_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmldate.c"
                  ,0xb,"datetime_t EBML_DateTime(const ebml_date *)");
  }
  if ((Element->Base).bValueIsSet == '\0') {
    Element_local._4_4_ = 0;
  }
  else {
    Element_local._4_4_ = (datetime_t)(Element->Value / 1000000000);
  }
  return Element_local._4_4_;
}

Assistant:

datetime_t EBML_DateTime(const ebml_date *Element)
{
    assert(Node_IsPartOf(Element,EBML_DATE_CLASS));
    if (!Element->Base.bValueIsSet)
        return 0;
    return (datetime_t)Scale32(Element->Value,1,1000000000); // nanoseconds to seconds
}